

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

void duckdb::CreateUpdateChunk
               (ExecutionContext *context,DataChunk *chunk,TableCatalogEntry *table,Vector *row_ids,
               DataChunk *update_chunk,PhysicalInsert *op)

{
  pointer *types;
  ClientContext *pCVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  type expression;
  reference pvVar4;
  pointer count_p;
  idx_t iVar5;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_111;
  ExpressionExecutor executor;
  ExpressionExecutor where_executor;
  DataChunk do_update_filter_result;
  
  if (update_chunk[4].vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    DataChunk::DataChunk(&do_update_filter_result);
    pCVar1 = context->client;
    LogicalType::LogicalType((LogicalType *)&where_executor,BOOLEAN);
    __l._M_len = 1;
    __l._M_array = (iterator)&where_executor;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&executor,__l,
               &local_111);
    DataChunk::Initialize
              (&do_update_filter_result,pCVar1,(vector<duckdb::LogicalType,_true> *)&executor,0x800)
    ;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&executor);
    LogicalType::~LogicalType((LogicalType *)&where_executor);
    pCVar1 = context->client;
    expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&update_chunk[4].vector_caches);
    ExpressionExecutor::ExpressionExecutor(&where_executor,pCVar1,expression);
    ExpressionExecutor::Execute(&where_executor,chunk,&do_update_filter_result);
    do_update_filter_result.count = chunk->count;
    DataChunk::Flatten(&do_update_filter_result);
    ManagedSelection::ManagedSelection((ManagedSelection *)&executor,chunk->count,true);
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&do_update_filter_result.data,0);
    pdVar2 = pvVar4->data;
    iVar3 = chunk->count;
    count_p = executor.expressions.
              super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
              super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (iVar5 = 0; iVar3 != iVar5; iVar5 = iVar5 + 1) {
      if (pdVar2[iVar5] == '\x01') {
        if (executor.states.
            super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          *(int *)((long)&(((executor.states.
                             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->
                           super_unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>_>
                           )._M_t.
                           super___uniq_ptr_impl<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ExpressionExecutorState_*,_std::default_delete<duckdb::ExpressionExecutorState>_>
                           .super__Head_base<0UL,_duckdb::ExpressionExecutorState_*,_false>.
                          _M_head_impl)->root_state + (long)count_p * 4) = (int)iVar5;
        }
        count_p = (pointer)((long)count_p + 1);
        executor.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = count_p;
      }
    }
    if (count_p !=
        executor.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      DataChunk::Slice(chunk,(SelectionVector *)&executor.chunk,(idx_t)count_p);
      chunk->count = (idx_t)executor.expressions.
                            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                            .
                            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      Vector::Slice((Vector *)table,(SelectionVector *)&executor.chunk,
                    (idx_t)executor.expressions.
                           super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                           .
                           super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      Vector::Flatten((Vector *)table,
                      (idx_t)executor.expressions.
                             super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                             .
                             super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
    }
    ManagedSelection::~ManagedSelection((ManagedSelection *)&executor);
    ExpressionExecutor::~ExpressionExecutor(&where_executor);
    DataChunk::~DataChunk(&do_update_filter_result);
  }
  types = &update_chunk[4].data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (chunk->count == 0) {
    where_executor.expressions.
    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
    ::std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&executor,
               ((long)update_chunk[4].data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
               (long)update_chunk[4].data.
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish) / 0x18,(bool *)&where_executor,
               (allocator_type *)&do_update_filter_result);
    DataChunk::Initialize
              ((DataChunk *)row_ids,context->client,(vector<duckdb::LogicalType,_true> *)types,
               (vector<bool,_true> *)&executor,chunk->count);
    (row_ids->type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)chunk->count;
    ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&executor);
  }
  else {
    DataChunk::Initialize
              ((DataChunk *)row_ids,context->client,(vector<duckdb::LogicalType,_true> *)types,
               chunk->count);
    ExpressionExecutor::ExpressionExecutor
              (&executor,context->client,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&update_chunk[3].count);
    ExpressionExecutor::Execute(&executor,chunk,(DataChunk *)row_ids);
    (row_ids->type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)chunk->count;
    ExpressionExecutor::~ExpressionExecutor(&executor);
  }
  return;
}

Assistant:

static void CreateUpdateChunk(ExecutionContext &context, DataChunk &chunk, TableCatalogEntry &table, Vector &row_ids,
                              DataChunk &update_chunk, const PhysicalInsert &op) {

	auto &do_update_condition = op.do_update_condition;
	auto &set_types = op.set_types;
	auto &set_expressions = op.set_expressions;

	// Check the optional condition for the DO UPDATE clause, to filter which rows will be updated
	if (do_update_condition) {
		DataChunk do_update_filter_result;
		do_update_filter_result.Initialize(context.client, {LogicalType::BOOLEAN});
		ExpressionExecutor where_executor(context.client, *do_update_condition);
		where_executor.Execute(chunk, do_update_filter_result);
		do_update_filter_result.SetCardinality(chunk.size());
		do_update_filter_result.Flatten();

		ManagedSelection selection(chunk.size());

		auto where_data = FlatVector::GetData<bool>(do_update_filter_result.data[0]);
		for (idx_t i = 0; i < chunk.size(); i++) {
			if (where_data[i]) {
				selection.Append(i);
			}
		}
		if (selection.Count() != selection.Size()) {
			// Not all conflicts met the condition, need to filter out the ones that don't
			chunk.Slice(selection.Selection(), selection.Count());
			chunk.SetCardinality(selection.Count());
			// Also apply this Slice to the to-update row_ids
			row_ids.Slice(selection.Selection(), selection.Count());
			row_ids.Flatten(selection.Count());
		}
	}

	if (chunk.size() == 0) {
		auto initialize = vector<bool>(set_types.size(), false);
		update_chunk.Initialize(context.client, set_types, initialize, chunk.size());
		update_chunk.SetCardinality(chunk);
		return;
	}

	// Execute the SET expressions.
	update_chunk.Initialize(context.client, set_types, chunk.size());
	ExpressionExecutor executor(context.client, set_expressions);
	executor.Execute(chunk, update_chunk);
	update_chunk.SetCardinality(chunk);
}